

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O1

void mserialize::detail::visit_impl<(anonymous_namespace)::StoreT<float>,InputStream>
               (string_view full_tag,string_view tag,StoreT<float> *visitor,InputStream *istream,
               int max_recursion)

{
  byte __rhs;
  code *pcVar1;
  double dVar2;
  StoreT<float> *visitor_00;
  float fVar3;
  char extraout_AL;
  bool bVar4;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  char extraout_AL_05;
  char extraout_AL_06;
  char extraout_AL_07;
  char extraout_AL_08;
  char extraout_AL_09;
  char extraout_AL_10;
  char extraout_AL_11;
  char extraout_AL_12;
  char extraout_AL_13;
  char extraout_AL_14;
  char extraout_AL_15;
  char extraout_AL_16;
  char extraout_AL_17;
  char extraout_AL_18;
  char extraout_AL_19;
  char extraout_AL_20;
  char extraout_AL_21;
  char extraout_AL_22;
  char extraout_AL_23;
  char extraout_AL_24;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  long *plVar10;
  runtime_error *prVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_04;
  size_t extraout_RDX_05;
  char *pcVar13;
  char cVar14;
  detail *pdVar15;
  ulong uVar16;
  long lVar17;
  detail *pdVar18;
  detail *in_R10;
  ulong uVar19;
  float max_recursion_00;
  detail *pdVar20;
  byte *pbVar21;
  ulong uVar22;
  char *pcVar23;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Da_22;
  undefined4 extraout_XMM0_Da_23;
  undefined4 extraout_XMM0_Da_24;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  string_view full_tag_00;
  string_view full_tag_01;
  string_view full_tag_02;
  string_view full_tag_03;
  string_view full_tag_04;
  string_view full_tag_05;
  string_view tag_00;
  string_view tag_01;
  string_view tag_02;
  string_view tag_03;
  string_view tag_04;
  string_view tag_05;
  string_view tags;
  string_view tags_00;
  string_view tags_01;
  string_view tags_02;
  string_view tags_03;
  string_view tags_04;
  uint8_t discriminator;
  float f;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  ostream *local_a8;
  float local_9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ulong local_78;
  StoreT<float> *local_70;
  detail *local_68;
  InputStream *local_60;
  float local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  size_t extraout_RDX_03;
  
  uVar7 = tag._len;
  pbVar21 = (byte *)tag._ptr;
  local_78 = full_tag._len;
  full_tag_00._ptr = (detail *)full_tag._ptr;
  if (max_recursion == 0) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,full_tag_00._ptr,full_tag_00._ptr + local_78);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   "Recursion limit exceeded while visiting tag: ",&local_98);
    std::runtime_error::runtime_error(prVar11,(string *)local_d0);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (uVar7 == 0) {
    return;
  }
  __rhs = *pbVar21;
  pdVar20 = (detail *)(ulong)__rhs;
  if (__rhs < 0x3c) {
    if (__rhs == 0x28) {
      pcVar13 = (char *)0x0;
      if (uVar7 != 1) {
        pcVar13 = (char *)(uVar7 - 2);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x2b,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
      if (extraout_AL_05 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      pdVar20 = (detail *)(pbVar21 + 1);
      doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
      tags_02._len = extraout_RDX_02;
      tags_02._ptr = pcVar13;
      pcVar9 = (char *)tag_first_size(pdVar20,tags_02);
      uVar7 = local_78;
      local_9c = (float)max_recursion;
      if (pcVar9 != (char *)0x0) {
        local_9c = (float)(max_recursion + -1);
        pcVar23 = pcVar9;
        if (pcVar13 < pcVar9) {
          pcVar23 = pcVar13;
        }
        pcVar13 = pcVar13 + -(long)pcVar23;
        pdVar15 = (detail *)(pcVar23 + (long)pdVar20);
        do {
          pdVar18 = pdVar15;
          full_tag_03._len = uVar7;
          full_tag_03._ptr = (char *)full_tag_00._ptr;
          tag_03._len = (size_t)pcVar9;
          tag_03._ptr = (char *)pdVar20;
          visit_impl<(anonymous_namespace)::StoreT<float>,InputStream>
                    (full_tag_03,tag_03,visitor,istream,(int)local_9c);
          tags_03._len = extraout_RDX_03;
          tags_03._ptr = pcVar13;
          pcVar9 = (char *)tag_first_size(pdVar18,tags_03);
          pcVar23 = pcVar9;
          if (pcVar13 < pcVar9) {
            pcVar23 = pcVar13;
          }
          pcVar13 = pcVar13 + -(long)pcVar23;
          pdVar15 = pdVar18 + (long)pcVar23;
          pdVar20 = pdVar18;
        } while (pcVar9 != (char *)0x0);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
      if (extraout_AL_06 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      goto LAB_00155768;
    }
    if (__rhs == 0x2f) {
      pbVar21 = pbVar21 + 1;
      if (uVar7 < 3) {
        lVar17 = 0;
        if (uVar7 != 1) {
          lVar17 = uVar7 - 2;
        }
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,pbVar21,pbVar21 + lVar17);
        std::operator+(&local_98,"Invalid enum tag: \'",&local_50);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_d0._0_8_ = *plVar10;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._0_8_ == paVar12) {
          local_c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_c0._8_8_ = plVar10[3];
          local_d0._0_8_ = &local_c0;
        }
        else {
          local_c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
        }
        local_d0._8_8_ = plVar10[1];
        *plVar10 = (long)paVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::runtime_error::runtime_error(prVar11,(string *)local_d0);
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_98.field_2._8_8_ = local_98.field_2._M_local_buf + 3;
      visit_arithmetic<mserialize::detail::IntegerToHex,InputStream>
                (*pbVar21,(IntegerToHex *)&local_98,istream);
      *(char *)(local_98.field_2._8_8_ + -1) = '\'';
      local_98.field_2._M_local_buf[3] = '`';
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
      if (extraout_AL_02 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      goto LAB_00155768;
    }
  }
  else {
    if (__rhs == 0x3c) {
      pdVar20 = (detail *)(pbVar21 + 1);
      pcVar13 = (char *)0x0;
      if (uVar7 != 1) {
        pcVar13 = (char *)(uVar7 - 2);
      }
      local_68 = full_tag_00._ptr;
      std::istream::read((char *)istream->stream,(long)&local_98);
      sVar6 = extraout_RDX_00;
      for (cVar14 = (char)local_98._M_dataplus._M_p; cVar14 != '\0'; cVar14 = cVar14 + -1) {
        tags_00._len = sVar6;
        tags_00._ptr = pcVar13;
        pcVar9 = (char *)tag_first_size(pdVar20,tags_00);
        if (pcVar13 < pcVar9) {
          pcVar9 = pcVar13;
        }
        pdVar20 = pdVar20 + (long)pcVar9;
        pcVar13 = pcVar13 + -(long)pcVar9;
        sVar6 = extraout_RDX_01;
      }
      tags_01._len = sVar6;
      tags_01._ptr = pcVar13;
      sVar6 = tag_first_size(pdVar20,tags_01);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x2b,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      uVar7 = local_78;
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
      if (extraout_AL_03 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
      if ((sVar6 == 1) && (iVar5 = bcmp(pdVar20,"0",1), iVar5 == 0)) {
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_14,extraout_XMM0_Da_14));
        if (extraout_AL_14 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
        doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
      }
      else {
        full_tag_02._len = uVar7;
        full_tag_02._ptr = (char *)local_68;
        tag_02._len = sVar6;
        tag_02._ptr = (char *)pdVar20;
        visit_impl<(anonymous_namespace)::StoreT<float>,InputStream>
                  (full_tag_02,tag_02,visitor,istream,max_recursion + -1);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
      if (extraout_AL_04 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      goto LAB_00155768;
    }
    if (__rhs == 0x7b) {
      uVar22 = uVar7 - 1;
      if (uVar7 == 0) {
        uVar22 = 0;
      }
      uVar8 = 0;
      if (uVar7 - 1 != 0) {
        uVar7 = 0;
        do {
          uVar8 = uVar7;
          if (pbVar21[uVar7] == 0x60) break;
          uVar7 = uVar7 + 1;
          uVar8 = uVar22;
        } while (uVar22 != uVar7);
      }
      uVar7 = uVar8;
      if (uVar22 < uVar8) {
        uVar7 = uVar22;
      }
      uVar22 = uVar22 - uVar7;
      if (uVar22 == 0) {
        uVar7 = local_78;
        pdVar15 = full_tag_00._ptr;
        if (uVar8 != 0) {
          do {
            if (uVar7 == 0) goto LAB_0015559c;
            uVar16 = uVar7;
            pdVar18 = pdVar15;
            do {
              uVar19 = 0;
              do {
                if (uVar16 == uVar19) {
                  bVar4 = false;
                  in_R10 = pdVar15 + uVar7;
                  goto LAB_001554f9;
                }
                if (pdVar18[uVar19] != *(detail *)(pbVar21 + uVar19)) {
                  bVar4 = true;
                  goto LAB_001554f9;
                }
                uVar19 = uVar19 + 1;
              } while (uVar8 != uVar19);
              bVar4 = false;
              in_R10 = pdVar18;
LAB_001554f9:
              pdVar18 = pdVar18 + 1;
              uVar16 = uVar16 - 1;
            } while (bVar4);
            uVar16 = (long)in_R10 - (long)pdVar15;
            if (in_R10 == pdVar15 + uVar7) {
              uVar16 = 0xffffffffffffffff;
            }
            if (uVar7 < uVar16) {
              uVar16 = uVar7;
            }
            uVar7 = uVar7 - uVar16;
            uVar19 = uVar8;
            if (uVar7 < uVar8) {
              uVar19 = uVar7;
            }
            pdVar15 = pdVar15 + uVar19 + uVar16;
            iVar5 = 3;
            uVar7 = uVar7 - uVar19;
            if ((uVar7 != 0) && (*pdVar15 != (detail)0x7d)) {
              if (*pdVar15 == (detail)0x60) {
                iVar5 = 1;
                pdVar20 = pdVar15;
                if (uVar7 == 1) {
                  uVar22 = 0;
                }
                else {
                  uVar22 = 1;
                  lVar17 = 1;
                  do {
                    if (pdVar15[uVar22] == (detail)0x7d) {
                      lVar17 = lVar17 + -1;
                      if (lVar17 == 0) goto LAB_0015558f;
                    }
                    else if (pdVar15[uVar22] == (detail)0x7b) {
                      lVar17 = lVar17 + 1;
                    }
                    uVar22 = uVar22 + 1;
                  } while (uVar7 != uVar22);
                  uVar22 = uVar7 - 1;
                }
              }
              else {
                iVar5 = 0;
              }
            }
LAB_0015558f:
          } while (iVar5 == 0);
          if (iVar5 == 1) goto LAB_001555a1;
        }
LAB_0015559c:
        pdVar20 = (detail *)0x0;
        uVar22 = 0;
      }
      else {
        pdVar20 = (detail *)(pbVar21 + uVar7);
      }
LAB_001555a1:
      local_70 = visitor;
      local_68 = full_tag_00._ptr;
      local_60 = istream;
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x2b,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10));
      if (extraout_AL_10 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
      if (uVar22 != 0) {
        sVar6 = extraout_RDX_04;
        do {
          uVar22 = uVar22 - 1;
          if (uVar22 == 0) {
            uVar7 = 1;
          }
          else {
            uVar8 = 0;
            do {
              uVar7 = uVar8;
              if (pdVar20[uVar8 + 1] == (detail)0x27) break;
              uVar8 = uVar8 + 1;
              uVar7 = uVar22;
            } while (uVar22 != uVar8);
            uVar7 = uVar7 + 1;
          }
          if (uVar22 < uVar7) {
            uVar7 = uVar22;
          }
          pdVar20 = pdVar20 + uVar7 + 1;
          pcVar23 = (char *)(uVar22 - uVar7);
          tags_04._len = sVar6;
          tags_04._ptr = pcVar23;
          pcVar9 = (char *)tag_first_size(pdVar20,tags_04);
          pcVar13 = pcVar9;
          if (pcVar23 < pcVar9) {
            pcVar13 = pcVar23;
          }
          doctest::detail::MessageBuilder::MessageBuilder
                    ((MessageBuilder *)local_d0,
                     "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                     ,0x28,is_require);
          std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
          dVar2 = doctest::detail::MessageBuilder::log
                            ((MessageBuilder *)local_d0,
                             (double)CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11));
          if (extraout_AL_11 != '\0') {
            pcVar1 = (code *)swi(3);
            (*pcVar1)(SUB84(dVar2,0));
            return;
          }
          doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
          doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
          full_tag_05._len = local_78;
          full_tag_05._ptr = (char *)local_68;
          tag_05._len = (size_t)pcVar9;
          tag_05._ptr = (char *)pdVar20;
          visit_impl<(anonymous_namespace)::StoreT<float>,InputStream>
                    (full_tag_05,tag_05,local_70,local_60,max_recursion + -1);
          doctest::detail::MessageBuilder::MessageBuilder
                    ((MessageBuilder *)local_d0,
                     "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                     ,0x28,is_require);
          std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
          dVar2 = doctest::detail::MessageBuilder::log
                            ((MessageBuilder *)local_d0,
                             (double)CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_12));
          if (extraout_AL_12 != '\0') {
            pcVar1 = (code *)swi(3);
            (*pcVar1)(SUB84(dVar2,0));
            return;
          }
          doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
          pdVar20 = pdVar20 + (long)pcVar13;
          uVar22 = (long)pcVar23 - (long)pcVar13;
          doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
          sVar6 = extraout_RDX_05;
        } while (uVar22 != 0);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_13,extraout_XMM0_Da_13));
      if (extraout_AL_13 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      goto LAB_00155768;
    }
    if (__rhs == 0x5b) {
      pdVar20 = (detail *)(pbVar21 + 1);
      local_70 = visitor;
      std::istream::read((char *)istream->stream,(long)&local_98);
      tags._len = extraout_RDX;
      tags._ptr = (char *)(uVar7 - 1);
      sVar6 = tag_first_size(pdVar20,tags);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x2b,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      uVar7 = local_78;
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      if (extraout_AL != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      max_recursion_00 = (float)(max_recursion + -1);
      doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
      if (((uint)local_98._M_dataplus._M_p < 0x21) ||
         (full_tag_00._len = uVar7, tag_00._len = sVar6, tag_00._ptr = (char *)pdVar20,
         bVar4 = singular_impl(full_tag_00,tag_00,(int)max_recursion_00), !bVar4)) {
        visitor_00 = local_70;
        iVar5 = (uint)local_98._M_dataplus._M_p;
        local_98._M_dataplus._M_p._0_4_ = (uint)local_98._M_dataplus._M_p + -1;
        fVar3 = local_9c;
        while (local_9c = max_recursion_00, iVar5 != 0) {
          full_tag_04._len = uVar7;
          full_tag_04._ptr = (char *)full_tag_00._ptr;
          tag_04._len = sVar6;
          tag_04._ptr = (char *)pdVar20;
          visit_impl<(anonymous_namespace)::StoreT<float>,InputStream>
                    (full_tag_04,tag_04,visitor_00,istream,(int)local_9c);
          iVar5 = (uint)local_98._M_dataplus._M_p;
          local_98._M_dataplus._M_p._0_4_ = (uint)local_98._M_dataplus._M_p + -1;
          max_recursion_00 = local_9c;
          fVar3 = local_9c;
        }
      }
      else {
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        uVar7 = local_78;
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        if (extraout_AL_00 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
        doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
        full_tag_01._len = uVar7;
        full_tag_01._ptr = (char *)full_tag_00._ptr;
        tag_01._len = sVar6;
        tag_01._ptr = (char *)pdVar20;
        visit_impl<(anonymous_namespace)::StoreT<float>,InputStream>
                  (full_tag_01,tag_01,local_70,istream,(int)max_recursion_00);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
        if (extraout_AL_01 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
        doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
        fVar3 = local_9c;
      }
      local_9c = fVar3;
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
      if (extraout_AL_08 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      goto LAB_00155768;
    }
  }
  if (__rhs < 0x62) {
    if (__rhs < 0x49) {
      if (__rhs == 0x42) {
        std::istream::read((char *)istream->stream,(long)&local_98);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_23,extraout_XMM0_Da_23));
        if (extraout_AL_23 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      }
      else {
        if (__rhs != 0x44) goto switchD_00155313_caseD_65;
        std::istream::read((char *)istream->stream,(long)&local_98);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_16,extraout_XMM0_Da_16));
        if (extraout_AL_16 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      }
    }
    else if (__rhs == 0x49) {
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_22,extraout_XMM0_Da_22));
      if (extraout_AL_22 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
    }
    else if (__rhs == 0x4c) {
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_21,extraout_XMM0_Da_21));
      if (extraout_AL_21 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
    }
    else {
      if (__rhs != 0x53) goto switchD_00155313_caseD_65;
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09));
      if (extraout_AL_09 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
    }
  }
  else {
    switch(__rhs) {
    case 0x62:
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
      if (extraout_AL_07 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      break;
    case 99:
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_18,extraout_XMM0_Da_18));
      if (extraout_AL_18 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      break;
    case 100:
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_17,extraout_XMM0_Da_17));
      if (extraout_AL_17 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      break;
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
switchD_00155313_caseD_65:
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Invalid arithmetic tag: ","");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     &local_98,__rhs);
      std::runtime_error::runtime_error(prVar11,(string *)local_d0);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    case 0x66:
      std::istream::read((char *)istream->stream,(long)&local_54);
      local_9c = local_54;
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer
                ((ExpressionDecomposer *)&local_50,DT_CHECK);
      local_98._M_dataplus._M_p =
           (pointer)((long)local_50._M_dataplus._M_p << 0x20 | (ulong)visitor->_has_visit ^ 1);
      doctest::detail::Expression_lhs::operator_cast_to_Result
                ((Result *)local_d0,(Expression_lhs *)&local_98);
      doctest::detail::decomp_assert
                ((detail *)0xa,0x1b93e8,(char *)0x22,0x1babc4,(char *)local_d0,(Result *)istream);
      doctest::String::~String((String *)(local_d0 + 8));
      visitor->_has_visit = true;
      visitor->_value = local_9c;
      return;
    case 0x69:
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_20,extraout_XMM0_Da_20));
      if (extraout_AL_20 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      break;
    case 0x6c:
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_19,extraout_XMM0_Da_19));
      if (extraout_AL_19 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      break;
    default:
      if (__rhs == 0x73) {
        std::istream::read((char *)istream->stream,(long)&local_98);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_24,extraout_XMM0_Da_24));
        if (extraout_AL_24 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      }
      else {
        if (__rhs != 0x79) goto switchD_00155313_caseD_65;
        std::istream::read((char *)istream->stream,(long)&local_98);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_15,extraout_XMM0_Da_15));
        if (extraout_AL_15 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      }
    }
  }
LAB_00155768:
  doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
  return;
}

Assistant:

void visit_impl(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  if (max_recursion == 0) { throw std::runtime_error("Recursion limit exceeded while visiting tag: " + full_tag.to_string()); }

  if (tag.empty()) { return; }

  switch (tag.front())
  {
  case '[':
    visit_sequence(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '(':
    visit_tuple(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '<':
    visit_variant(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '{':
    visit_struct(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '/':
    visit_enum(tag, visitor, istream);
    break;
  default:
    visit_arithmetic(tag.front(), visitor, istream);
  }
}